

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMapInfo.h
# Opt level: O0

bool llvm::DenseMapInfo<llvm::StringRef>::isEqual(StringRef LHS,StringRef RHS)

{
  size_t __n;
  char *__s2;
  char *__s1;
  StringRef SVar1;
  bool local_159;
  char *local_118;
  char *local_108;
  char *local_f8;
  char *local_e8;
  StringRef RHS_local;
  StringRef LHS_local;
  char *local_50;
  size_t local_48;
  char **local_40;
  char *local_38;
  size_t local_30;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  __s1 = LHS.Data;
  __n = RHS.Length;
  __s2 = RHS.Data;
  SVar1 = getEmptyKey();
  local_e8 = SVar1.Data;
  if (__s2 == local_e8) {
    SVar1 = getEmptyKey();
    local_f8 = SVar1.Data;
    LHS_local.Length._7_1_ = __s1 == local_f8;
  }
  else {
    SVar1 = getTombstoneKey();
    local_108 = SVar1.Data;
    if (__s2 == local_108) {
      SVar1 = getTombstoneKey();
      local_118 = SVar1.Data;
      LHS_local.Length._7_1_ = __s1 == local_118;
    }
    else {
      local_40 = &local_50;
      local_159 = false;
      if (LHS.Length == __n) {
        if (__n == 0) {
          local_c = 0;
        }
        else {
          local_50 = __s1;
          local_48 = LHS.Length;
          local_38 = __s2;
          local_30 = __n;
          local_28 = __n;
          local_20 = __s2;
          local_18 = __s1;
          local_c = memcmp(__s1,__s2,__n);
        }
        local_159 = local_c == 0;
      }
      LHS_local.Length._7_1_ = local_159;
    }
  }
  return LHS_local.Length._7_1_;
}

Assistant:

static bool isEqual(StringRef LHS, StringRef RHS) {
    if (RHS.data() == getEmptyKey().data())
      return LHS.data() == getEmptyKey().data();
    if (RHS.data() == getTombstoneKey().data())
      return LHS.data() == getTombstoneKey().data();
    return LHS == RHS;
  }